

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool __thiscall ON_NurbsCurve::SetDomain(ON_NurbsCurve *this,double t0,double t1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  iVar4 = this->m_order;
  if (((1 < (long)iVar4) && (iVar4 <= this->m_cv_count)) &&
     (pdVar5 = this->m_knot, t0 < t1 && pdVar5 != (double *)0x0)) {
    dVar1 = pdVar5[(long)iVar4 + -2];
    dVar2 = pdVar5[(long)this->m_cv_count + -1];
    if ((dVar1 == t0) && (!NAN(dVar1) && !NAN(t0))) {
      if ((dVar2 == t1) && (!NAN(dVar2) && !NAN(t1))) {
        return true;
      }
    }
    if (dVar1 < dVar2) {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      uVar6 = ON_KnotCount(this->m_order,this->m_cv_count);
      if ((int)uVar6 < 1) {
        return true;
      }
      dVar9 = (dVar1 + dVar2) * 0.5;
      pdVar5 = this->m_knot;
      uVar7 = 0;
      do {
        dVar3 = pdVar5[uVar7];
        dVar10 = t1;
        if (dVar3 <= dVar9) {
          dVar10 = t0;
        }
        uVar8 = -(ulong)(dVar9 < dVar3);
        pdVar5[uVar7] =
             (dVar3 - (double)(~uVar8 & (ulong)dVar1 | uVar8 & (ulong)dVar2)) *
             ((t1 - t0) / (dVar2 - dVar1)) + dVar10;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_NurbsCurve::SetDomain( double t0, double t1 )
{
  bool rc = false;
  if ( m_order >= 2 && m_cv_count >= m_order && m_knot && t0 < t1 ) {
	 //DestroyCurveTree();
   const double k0 = m_knot[m_order-2];
    const double k1 = m_knot[m_cv_count-1];
    if ( k0 == t0 && k1 == t1 )
      rc = true;
    else if ( k0 < k1 ) 
    {
      DestroyCurveTree();
      const double d = (t1-t0)/(k1-k0);
      const double km = 0.5*(k0+k1);
      const int knot_count = KnotCount();
      int i;
      for ( i = 0; i < knot_count; i++ ) 
      {
        if ( m_knot[i] <= km ) {
          m_knot[i] = (m_knot[i] - k0)*d + t0;
        }
        else {
          m_knot[i] = (m_knot[i] - k1)*d + t1;
        }
      }
      rc = true;
    }
  }
  return rc;
}